

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_reader.cxx
# Opt level: O1

size_t __thiscall
xray_re::xr_reader::r_raw_chunk(xr_reader *this,uint32_t id,void *dest,size_t dest_size)

{
  undefined8 in_RAX;
  size_t __n;
  bool compressed;
  bool local_21;
  
  local_21 = SUB81((ulong)in_RAX >> 0x38,0);
  __n = find_chunk(this,id,&local_21,true);
  if (__n == 0) {
    __n = 0;
  }
  else {
    if (local_21 == true) {
      __assert_fail("!compressed",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_reader.cxx"
                    ,99,"size_t xray_re::xr_reader::r_raw_chunk(uint32_t, void *, size_t)");
    }
    if (dest_size < __n) {
      __assert_fail("size <= dest_size",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_reader.cxx"
                    ,100,"size_t xray_re::xr_reader::r_raw_chunk(uint32_t, void *, size_t)");
    }
    if (this->m_end < (this->field_2).m_p + __n) {
      __assert_fail("m_p + dest_size <= m_end",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_reader.cxx"
                    ,0x6b,"void xray_re::xr_reader::r_raw(void *, size_t)");
    }
    memmove(dest,(this->field_2).m_p,__n);
    (this->field_2).m_p = (this->field_2).m_p + __n;
  }
  return __n;
}

Assistant:

size_t xr_reader::r_raw_chunk(uint32_t id, void *dest, size_t dest_size)
{
	bool compressed;
	size_t size = find_chunk(id, &compressed);
	if (size == 0)
		return 0;
	assert(!compressed);
	assert(size <= dest_size);
	r_raw(dest, size);
	return size;
}